

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_common_node_preamble
               (fy_emitter *emit,fy_token *fyt_anchor,fy_token *fyt_tag,int flags,int indent)

{
  _Bool _Var1;
  size_t sStack_68;
  _Bool json_mode;
  size_t anchor_len;
  size_t tag_len;
  size_t td_handle_size;
  size_t td_prefix_size;
  char *td_handle;
  char *td_prefix;
  char *tag;
  char *anchor;
  int indent_local;
  int flags_local;
  fy_token *fyt_tag_local;
  fy_token *fyt_anchor_local;
  fy_emitter *emit_local;
  
  tag = (char *)0x0;
  td_prefix = (char *)0x0;
  anchor_len = 0;
  sStack_68 = 0;
  anchor._0_4_ = indent;
  anchor._4_4_ = flags;
  _indent_local = fyt_tag;
  fyt_tag_local = fyt_anchor;
  fyt_anchor_local = (fy_token *)emit;
  _Var1 = fy_emit_is_json_mode(emit);
  if (!_Var1) {
    if (((**(uint **)&fyt_anchor_local->analyze_flags & 4) == 0) &&
       (fyt_tag_local != (fy_token *)0x0)) {
      tag = fy_token_get_text(fyt_tag_local,&stack0xffffffffffffff98);
    }
    if (((**(uint **)&fyt_anchor_local->analyze_flags & 8) == 0) &&
       (_indent_local != (fy_token *)0x0)) {
      td_prefix = fy_token_get_text(_indent_local,&anchor_len);
    }
    if (tag != (char *)0x0) {
      fy_emit_write_indicator
                ((fy_emitter *)fyt_anchor_local,di_ambersand,anchor._4_4_,(int)anchor,fyewt_anchor);
      fy_emit_write((fy_emitter *)fyt_anchor_local,fyewt_anchor,tag,(int)sStack_68);
    }
    if (td_prefix != (char *)0x0) {
      _Var1 = fy_emit_whitespace((fy_emitter *)fyt_anchor_local);
      if (!_Var1) {
        fy_emit_write_ws((fy_emitter *)fyt_anchor_local);
      }
      td_prefix_size = (size_t)fy_tag_token_get_directive_handle(_indent_local,&tag_len);
      if ((char *)td_prefix_size == (char *)0x0) {
        __assert_fail("td_handle",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.c"
                      ,0x237,
                      "void fy_emit_common_node_preamble(struct fy_emitter *, struct fy_token *, struct fy_token *, int, int)"
                     );
      }
      td_handle = fy_tag_token_get_directive_prefix(_indent_local,&td_handle_size);
      if (td_handle == (char *)0x0) {
        __assert_fail("td_prefix",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.c"
                      ,0x239,
                      "void fy_emit_common_node_preamble(struct fy_emitter *, struct fy_token *, struct fy_token *, int, int)"
                     );
      }
      if (tag_len == 0) {
        fy_emit_printf((fy_emitter *)fyt_anchor_local,fyewt_tag,"!<%.*s>",anchor_len & 0xffffffff,
                       td_prefix);
      }
      else {
        fy_emit_printf((fy_emitter *)fyt_anchor_local,fyewt_tag,"%.*s%.*s",tag_len & 0xffffffff,
                       td_prefix_size,(ulong)(uint)((int)anchor_len - (int)td_handle_size),
                       td_prefix + td_handle_size);
      }
      *(uint *)((long)&(fyt_anchor_local->node).prev + 4) =
           *(uint *)((long)&(fyt_anchor_local->node).prev + 4) & 0xfffffffc;
    }
  }
  if ((((anchor._4_4_ & 1) != 0) && (*(int *)((long)&(fyt_anchor_local->node).next + 4) != 0)) &&
     (((ulong)(fyt_anchor_local->node).prev & 0x800000000) == 0)) {
    fy_emit_putc((fy_emitter *)fyt_anchor_local,fyewt_linebreak,10);
    *(undefined4 *)((long)&(fyt_anchor_local->node).prev + 4) = 3;
  }
  return;
}

Assistant:

void fy_emit_common_node_preamble(struct fy_emitter *emit,
                                  struct fy_token *fyt_anchor,
                                  struct fy_token *fyt_tag,
                                  int flags, int indent) {
    const char *anchor = NULL;
    const char *tag = NULL;
    const char *td_prefix __FY_DEBUG_UNUSED__;
    const char *td_handle;
    size_t td_prefix_size, td_handle_size;
    size_t tag_len = 0, anchor_len = 0;
    bool json_mode = false;

    json_mode = fy_emit_is_json_mode(emit);

    if (!json_mode) {
        if (!(emit->cfg->flags & FYECF_STRIP_LABELS)) {
            if (fyt_anchor)
                anchor = fy_token_get_text(fyt_anchor, &anchor_len);
        }

        if (!(emit->cfg->flags & FYECF_STRIP_TAGS)) {
            if (fyt_tag)
                tag = fy_token_get_text(fyt_tag, &tag_len);
        }

        if (anchor) {
            fy_emit_write_indicator(emit, di_ambersand, flags, indent, fyewt_anchor);
            fy_emit_write(emit, fyewt_anchor, anchor, anchor_len);
        }

        if (tag) {
            if (!fy_emit_whitespace(emit))
                fy_emit_write_ws(emit);

            td_handle = fy_tag_token_get_directive_handle(fyt_tag, &td_handle_size);
            assert(td_handle);
            td_prefix = fy_tag_token_get_directive_prefix(fyt_tag, &td_prefix_size);
            assert(td_prefix);

            if (!td_handle_size)
                fy_emit_printf(emit, fyewt_tag, "!<%.*s>", (int) tag_len, tag);
            else
                fy_emit_printf(emit, fyewt_tag, "%.*s%.*s",
                               (int) td_handle_size, td_handle,
                               (int) (tag_len - td_prefix_size), tag + td_prefix_size);

            emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
        }
    }

    /* content for root always starts on a new line */
    if ((flags & DDNF_ROOT) && emit->column != 0 &&
        !(emit->flags & FYEF_HAD_DOCUMENT_START)) {
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
    }
}